

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O1

bool __thiscall
cmConditionEvaluator::HandleLevel1
          (cmConditionEvaluator *this,cmArgumentList *newArgs,string *param_2,MessageType *param_3)

{
  _List_node_base *p_Var1;
  iterator iVar2;
  bool bVar3;
  int iVar4;
  cmState *this_00;
  cmCommand *pcVar5;
  cmTarget *pcVar6;
  char *pcVar7;
  cmExpandedCommandArgument *pcVar8;
  cmConditionEvaluator *pcVar9;
  string *psVar10;
  cmMakefile *pcVar11;
  PolicyID pid;
  int reducible;
  iterator argP1;
  iterator arg;
  iterator argP2;
  allocator local_91;
  undefined1 local_90 [16];
  undefined8 local_80;
  int local_6c;
  iterator local_68;
  iterator local_60;
  iterator local_58;
  undefined1 *local_50;
  size_type local_40;
  
  do {
    local_6c = 0;
    local_60._M_node =
         (newArgs->
         super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>).
         _M_impl._M_node.super__List_node_base._M_next;
    local_58._M_node = (_List_node_base *)0x0;
    for (; local_60._M_node != (_List_node_base *)newArgs;
        local_60._M_node =
             (((_List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
              &(local_60._M_node)->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
      local_68._M_node = local_60._M_node;
      if (local_60._M_node != (_List_node_base *)newArgs) {
        local_68._M_node = (local_60._M_node)->_M_next;
        local_58._M_node = local_68._M_node;
        if (local_68._M_node != (_List_node_base *)newArgs) {
          local_58._M_node = (local_68._M_node)->_M_next;
        }
      }
      local_90._0_8_ = (cmConditionEvaluator *)&stack0xffffffffffffff80;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"EXISTS","");
      pcVar8 = (cmExpandedCommandArgument *)(local_60._M_node + 1);
      bVar3 = IsKeyword(this,(string *)local_90,pcVar8);
      iVar2._M_node = local_68._M_node;
      if (bVar3) {
        if ((cmConditionEvaluator *)local_90._0_8_ !=
            (cmConditionEvaluator *)&stack0xffffffffffffff80) {
          operator_delete((void *)local_90._0_8_,local_80 + 1);
        }
        if (iVar2._M_node != (_List_node_base *)newArgs) {
          pcVar9 = (cmConditionEvaluator *)iVar2._M_node[1]._M_next;
          bVar3 = cmsys::SystemTools::FileExists((char *)pcVar9);
          HandlePredicate(pcVar9,bVar3,&stack0xffffffffffffff94,&stack0xffffffffffffffa0,newArgs,
                          &stack0xffffffffffffff98,&stack0xffffffffffffffa8);
        }
      }
      else if ((cmConditionEvaluator *)local_90._0_8_ !=
               (cmConditionEvaluator *)&stack0xffffffffffffff80) {
        operator_delete((void *)local_90._0_8_,local_80 + 1);
      }
      local_90._0_8_ = (cmConditionEvaluator *)&stack0xffffffffffffff80;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"IS_DIRECTORY","");
      bVar3 = IsKeyword(this,(string *)local_90,pcVar8);
      iVar2._M_node = local_68._M_node;
      if (bVar3) {
        if ((cmConditionEvaluator *)local_90._0_8_ !=
            (cmConditionEvaluator *)&stack0xffffffffffffff80) {
          operator_delete((void *)local_90._0_8_,local_80 + 1);
        }
        if (iVar2._M_node != (_List_node_base *)newArgs) {
          std::__cxx11::string::string
                    ((string *)local_90,(char *)iVar2._M_node[1]._M_next,&local_91);
          psVar10 = (string *)local_90;
          bVar3 = cmsys::SystemTools::FileIsDirectory((string *)local_90);
          HandlePredicate((cmConditionEvaluator *)psVar10,bVar3,&stack0xffffffffffffff94,
                          &stack0xffffffffffffffa0,newArgs,&stack0xffffffffffffff98,
                          &stack0xffffffffffffffa8);
          goto LAB_00266ced;
        }
      }
      else {
LAB_00266ced:
        if ((cmConditionEvaluator *)local_90._0_8_ !=
            (cmConditionEvaluator *)&stack0xffffffffffffff80) {
          operator_delete((void *)local_90._0_8_,local_80 + 1);
        }
      }
      local_90._0_8_ = (cmConditionEvaluator *)&stack0xffffffffffffff80;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"IS_SYMLINK","");
      bVar3 = IsKeyword(this,(string *)local_90,pcVar8);
      iVar2._M_node = local_68._M_node;
      if (bVar3) {
        if ((cmConditionEvaluator *)local_90._0_8_ !=
            (cmConditionEvaluator *)&stack0xffffffffffffff80) {
          operator_delete((void *)local_90._0_8_,local_80 + 1);
        }
        if (iVar2._M_node != (_List_node_base *)newArgs) {
          std::__cxx11::string::string
                    ((string *)local_90,(char *)iVar2._M_node[1]._M_next,&local_91);
          psVar10 = (string *)local_90;
          bVar3 = cmsys::SystemTools::FileIsSymlink((string *)local_90);
          HandlePredicate((cmConditionEvaluator *)psVar10,bVar3,&stack0xffffffffffffff94,
                          &stack0xffffffffffffffa0,newArgs,&stack0xffffffffffffff98,
                          &stack0xffffffffffffffa8);
          goto LAB_00266d8e;
        }
      }
      else {
LAB_00266d8e:
        if ((cmConditionEvaluator *)local_90._0_8_ !=
            (cmConditionEvaluator *)&stack0xffffffffffffff80) {
          operator_delete((void *)local_90._0_8_,local_80 + 1);
        }
      }
      local_90._0_8_ = (cmConditionEvaluator *)&stack0xffffffffffffff80;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"IS_ABSOLUTE","");
      bVar3 = IsKeyword(this,(string *)local_90,pcVar8);
      iVar2._M_node = local_68._M_node;
      if (bVar3) {
        if ((cmConditionEvaluator *)local_90._0_8_ !=
            (cmConditionEvaluator *)&stack0xffffffffffffff80) {
          operator_delete((void *)local_90._0_8_,local_80 + 1);
        }
        if (iVar2._M_node != (_List_node_base *)newArgs) {
          pcVar9 = (cmConditionEvaluator *)iVar2._M_node[1]._M_next;
          bVar3 = cmsys::SystemTools::FileIsFullPath((char *)pcVar9);
          HandlePredicate(pcVar9,bVar3,&stack0xffffffffffffff94,&stack0xffffffffffffffa0,newArgs,
                          &stack0xffffffffffffff98,&stack0xffffffffffffffa8);
        }
      }
      else if ((cmConditionEvaluator *)local_90._0_8_ !=
               (cmConditionEvaluator *)&stack0xffffffffffffff80) {
        operator_delete((void *)local_90._0_8_,local_80 + 1);
      }
      local_90._0_8_ = (cmConditionEvaluator *)&stack0xffffffffffffff80;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"COMMAND","");
      pcVar8 = (cmExpandedCommandArgument *)(local_60._M_node + 1);
      bVar3 = IsKeyword(this,(string *)local_90,pcVar8);
      iVar2._M_node = local_68._M_node;
      if (bVar3) {
        if ((cmConditionEvaluator *)local_90._0_8_ !=
            (cmConditionEvaluator *)&stack0xffffffffffffff80) {
          operator_delete((void *)local_90._0_8_,local_80 + 1);
        }
        if (iVar2._M_node != (_List_node_base *)newArgs) {
          this_00 = cmMakefile::GetState(this->Makefile);
          std::__cxx11::string::string
                    ((string *)local_90,(char *)iVar2._M_node[1]._M_next,&local_91);
          pcVar5 = cmState::GetCommand(this_00,(string *)local_90);
          pcVar9 = (cmConditionEvaluator *)local_90._0_8_;
          if ((cmConditionEvaluator *)local_90._0_8_ !=
              (cmConditionEvaluator *)&stack0xffffffffffffff80) {
            operator_delete((void *)local_90._0_8_,local_80 + 1);
          }
          HandlePredicate(pcVar9,pcVar5 != (cmCommand *)0x0,&stack0xffffffffffffff94,
                          &stack0xffffffffffffffa0,newArgs,&stack0xffffffffffffff98,
                          &stack0xffffffffffffffa8);
        }
      }
      else if ((cmConditionEvaluator *)local_90._0_8_ !=
               (cmConditionEvaluator *)&stack0xffffffffffffff80) {
        operator_delete((void *)local_90._0_8_,local_80 + 1);
      }
      local_90._0_8_ = (cmMakefile *)&stack0xffffffffffffff80;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"POLICY","");
      bVar3 = IsKeyword(this,(string *)local_90,pcVar8);
      iVar2._M_node = local_68._M_node;
      if (bVar3) {
        if ((cmMakefile *)local_90._0_8_ != (cmMakefile *)&stack0xffffffffffffff80) {
          operator_delete((void *)local_90._0_8_,local_80 + 1);
        }
        if (iVar2._M_node != (_List_node_base *)newArgs) {
          pcVar9 = (cmConditionEvaluator *)iVar2._M_node[1]._M_next;
          bVar3 = cmPolicies::GetPolicyID((char *)pcVar9,(PolicyID *)local_90);
          HandlePredicate(pcVar9,bVar3,&stack0xffffffffffffff94,&stack0xffffffffffffffa0,newArgs,
                          &stack0xffffffffffffff98,&stack0xffffffffffffffa8);
        }
      }
      else if ((cmMakefile *)local_90._0_8_ != (cmMakefile *)&stack0xffffffffffffff80) {
        operator_delete((void *)local_90._0_8_,local_80 + 1);
      }
      local_90._0_8_ = (cmMakefile *)&stack0xffffffffffffff80;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"TARGET","");
      bVar3 = IsKeyword(this,(string *)local_90,pcVar8);
      iVar2._M_node = local_68._M_node;
      if (bVar3) {
        if ((cmMakefile *)local_90._0_8_ != (cmMakefile *)&stack0xffffffffffffff80) {
          operator_delete((void *)local_90._0_8_,local_80 + 1);
        }
        if (iVar2._M_node != (_List_node_base *)newArgs) {
          pcVar11 = this->Makefile;
          pcVar6 = cmMakefile::FindTargetToUse(pcVar11,(string *)(iVar2._M_node + 1),false);
          HandlePredicate((cmConditionEvaluator *)pcVar11,pcVar6 != (cmTarget *)0x0,
                          &stack0xffffffffffffff94,&stack0xffffffffffffffa0,newArgs,
                          &stack0xffffffffffffff98,&stack0xffffffffffffffa8);
        }
      }
      else if ((cmMakefile *)local_90._0_8_ != (cmMakefile *)&stack0xffffffffffffff80) {
        operator_delete((void *)local_90._0_8_,local_80 + 1);
      }
      local_90._0_8_ = (cmMakefile *)&stack0xffffffffffffff80;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"DEFINED","");
      bVar3 = IsKeyword(this,(string *)local_90,pcVar8);
      iVar2._M_node = local_68._M_node;
      if (bVar3) {
        if ((cmMakefile *)local_90._0_8_ != (cmMakefile *)&stack0xffffffffffffff80) {
          operator_delete((void *)local_90._0_8_,local_80 + 1);
        }
        if (iVar2._M_node != (_List_node_base *)newArgs) {
          p_Var1 = iVar2._M_node[1]._M_prev;
          psVar10 = (string *)(iVar2._M_node + 1);
          bVar3 = false;
          if ((_List_node_base *)0x4 < p_Var1) {
            std::__cxx11::string::substr((ulong)&stack0xffffffffffffffb0,(ulong)psVar10);
            iVar4 = std::__cxx11::string::compare((char *)&stack0xffffffffffffffb0);
            bVar3 = false;
            if (iVar4 == 0) {
              bVar3 = ((psVar10->_M_dataplus)._M_p + -1)[(long)p_Var1] == '}';
            }
          }
          if (((_List_node_base *)0x4 < p_Var1) &&
             ((size_type *)local_50 != &stack0xffffffffffffffc0)) {
            operator_delete(local_50,local_40 + 1);
          }
          if (bVar3) {
            std::__cxx11::string::substr((ulong)local_90,(ulong)psVar10);
            pcVar7 = cmsys::SystemTools::GetEnv((char *)local_90._0_8_);
            bVar3 = pcVar7 != (char *)0x0;
            pcVar11 = (cmMakefile *)local_90._0_8_;
            if ((cmMakefile *)local_90._0_8_ != (cmMakefile *)&stack0xffffffffffffff80) {
              operator_delete((void *)local_90._0_8_,local_80 + 1);
            }
          }
          else {
            pcVar11 = this->Makefile;
            bVar3 = cmMakefile::IsDefinitionSet(pcVar11,psVar10);
          }
          HandlePredicate((cmConditionEvaluator *)pcVar11,bVar3,&stack0xffffffffffffff94,
                          &stack0xffffffffffffffa0,newArgs,&stack0xffffffffffffff98,
                          &stack0xffffffffffffffa8);
        }
      }
      else if ((cmMakefile *)local_90._0_8_ != (cmMakefile *)&stack0xffffffffffffff80) {
        operator_delete((void *)local_90._0_8_,local_80 + 1);
      }
    }
    if (local_6c == 0) {
      return true;
    }
  } while( true );
}

Assistant:

bool cmConditionEvaluator::HandleLevel1(cmArgumentList &newArgs,
                  std::string &, cmake::MessageType &)
{
  int reducible;
  do
    {
    reducible = 0;
    cmArgumentList::iterator arg = newArgs.begin();
    cmArgumentList::iterator argP1;
    cmArgumentList::iterator argP2;
    while (arg != newArgs.end())
      {
      argP1 = arg;
      this->IncrementArguments(newArgs,argP1,argP2);
      // does a file exist
      if (this->IsKeyword("EXISTS", *arg) && argP1  != newArgs.end())
        {
        this->HandlePredicate(
          cmSystemTools::FileExists(argP1->c_str()),
          reducible, arg, newArgs, argP1, argP2);
        }
      // does a directory with this name exist
      if (this->IsKeyword("IS_DIRECTORY", *arg) && argP1  != newArgs.end())
        {
        this->HandlePredicate(
          cmSystemTools::FileIsDirectory(argP1->c_str()),
          reducible, arg, newArgs, argP1, argP2);
        }
      // does a symlink with this name exist
      if (this->IsKeyword("IS_SYMLINK", *arg) && argP1  != newArgs.end())
        {
        this->HandlePredicate(
          cmSystemTools::FileIsSymlink(argP1->c_str()),
          reducible, arg, newArgs, argP1, argP2);
        }
      // is the given path an absolute path ?
      if (this->IsKeyword("IS_ABSOLUTE", *arg) && argP1  != newArgs.end())
        {
        this->HandlePredicate(
          cmSystemTools::FileIsFullPath(argP1->c_str()),
          reducible, arg, newArgs, argP1, argP2);
        }
      // does a command exist
      if (this->IsKeyword("COMMAND", *arg) && argP1  != newArgs.end())
        {
        cmCommand* command =
            this->Makefile.GetState()->GetCommand(argP1->c_str());
        this->HandlePredicate(
          command ? true : false,
          reducible, arg, newArgs, argP1, argP2);
        }
      // does a policy exist
      if (this->IsKeyword("POLICY", *arg) && argP1 != newArgs.end())
        {
        cmPolicies::PolicyID pid;
        this->HandlePredicate(
          cmPolicies::GetPolicyID(argP1->c_str(), pid),
            reducible, arg, newArgs, argP1, argP2);
        }
      // does a target exist
      if (this->IsKeyword("TARGET", *arg) && argP1 != newArgs.end())
        {
        this->HandlePredicate(
          this->Makefile.FindTargetToUse(argP1->GetValue())?true:false,
          reducible, arg, newArgs, argP1, argP2);
        }
      // is a variable defined
      if (this->IsKeyword("DEFINED", *arg) && argP1  != newArgs.end())
        {
        size_t argP1len = argP1->GetValue().size();
        bool bdef = false;
        if(argP1len > 4 && argP1->GetValue().substr(0, 4) == "ENV{" &&
           argP1->GetValue().operator[](argP1len-1) == '}')
          {
          std::string env = argP1->GetValue().substr(4, argP1len-5);
          bdef = cmSystemTools::GetEnv(env.c_str())?true:false;
          }
        else
          {
          bdef = this->Makefile.IsDefinitionSet(argP1->GetValue());
          }
        this->HandlePredicate(bdef, reducible, arg, newArgs, argP1, argP2);
        }
      ++arg;
      }
    }
  while (reducible);
  return true;
}